

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMesh2.c
# Opt level: O2

int Bmc_MeshAddOneHotness2(sat_solver *pSat,int iFirst,int iLast)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  char *__assertion;
  ulong uVar5;
  uint uVar6;
  int *piVar7;
  int pLits [2];
  sat_solver *local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  int pVars [100];
  
  local_1e0 = pSat;
  if ((iFirst < iLast) && (iLast < iFirst + 0x6e)) {
    uVar6 = 0;
    do {
      if (iLast <= iFirst) {
        iVar1 = 0;
        if (1 < (int)uVar6) {
          local_1d8 = (ulong)uVar6;
          iVar4 = 1;
          piVar7 = pVars;
          iVar1 = 0;
          uVar5 = 0;
          while (piVar7 = piVar7 + 1, uVar5 != local_1d8) {
            local_1d0 = uVar5 + 1;
            for (lVar3 = 0; (int)lVar3 + iVar4 < (int)uVar6; lVar3 = lVar3 + 1) {
              pLits[0] = Abc_Var2Lit(pVars[uVar5],1);
              pLits[1] = Abc_Var2Lit(piVar7[lVar3],1);
              iVar2 = sat_solver_addclause(local_1e0,pLits,(lit *)&local_1e0);
              if (iVar2 == 0) {
                __assertion = "RetValue";
                uVar6 = 0x5c;
                goto LAB_004b0fa5;
              }
            }
            iVar4 = iVar4 + 1;
            iVar1 = iVar1 + (int)lVar3;
            uVar5 = local_1d0;
          }
        }
        return iVar1;
      }
      iVar1 = Bmc_MeshVarValue2(local_1e0,iFirst);
      if (iVar1 != 0) {
        if (99 < (int)uVar6) {
          __assertion = "nVars < 100";
          uVar6 = 0x51;
          goto LAB_004b0fa5;
        }
        lVar3 = (long)(int)uVar6;
        uVar6 = uVar6 + 1;
        pVars[lVar3] = iFirst;
      }
      iFirst = iFirst + 1;
    } while( true );
  }
  __assertion = "iFirst < iLast && iFirst + 110 > iLast";
  uVar6 = 0x4d;
LAB_004b0fa5:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                ,uVar6,"int Bmc_MeshAddOneHotness2(sat_solver *, int, int)");
}

Assistant:

int Bmc_MeshAddOneHotness2( sat_solver * pSat, int iFirst, int iLast )
{
    int i, j, v, pVars[100], nVars  = 0, nCount = 0;
    assert( iFirst < iLast && iFirst + 110 > iLast );
    for ( v = iFirst; v < iLast; v++ )
        if ( Bmc_MeshVarValue2(pSat, v) ) // v = 1
        {
            assert( nVars < 100 );
            pVars[ nVars++ ] = v;
        }
    if ( nVars <= 1 )
        return 0;
    for ( i = 0;   i < nVars; i++ )
    for ( j = i+1; j < nVars; j++ )
    {
        int pLits[2], RetValue;
        pLits[0] = Abc_Var2Lit( pVars[i], 1 );
        pLits[1] = Abc_Var2Lit( pVars[j], 1 );
        RetValue = sat_solver_addclause( pSat, pLits, pLits+2 );  assert( RetValue );
        nCount++;
    }
    return nCount;
}